

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::is_nullable_type(FieldGeneratorBase *this)

{
  byte bVar1;
  Type TVar2;
  LogMessage *other;
  LogFinisher local_41;
  LogMessage local_40;
  
  TVar2 = FieldDescriptor::type(this->descriptor_);
  if (TVar2 - TYPE_DOUBLE < 0x12) {
    bVar1 = (byte)(0xf00 >> ((byte)(TVar2 - TYPE_DOUBLE) & 0x1f));
  }
  else {
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x119);
    other = internal::LogMessage::operator<<(&local_40,"Unknown field type.");
    internal::LogFinisher::operator=(&local_41,other);
    internal::LogMessage::~LogMessage(&local_40);
    bVar1 = 1;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool FieldGeneratorBase::is_nullable_type() {
  switch (descriptor_->type()) {
    case FieldDescriptor::TYPE_ENUM:
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_BOOL:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SFIXED64:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SINT64:
      return false;

    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES:
      return true;

    default:
      GOOGLE_LOG(FATAL)<< "Unknown field type.";
      return true;
  }
}